

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Lf_Cut_t * Lf_ManFetchSet(Lf_Man_t *p,int i)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  void *pvVar4;
  int uMaskShift;
  Lf_Cut_t *pCut;
  int Entry;
  int iOffSet;
  Gia_Obj_t *pObj;
  int uMaskPage;
  int i_local;
  Lf_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,i);
  iVar1 = Vec_IntEntry(&p->vOffsets,i);
  pCut._0_4_ = Vec_IntEntry(&p->vCutSets,iVar1);
  iVar2 = Gia_ObjIsAndNotBuf(pObj_00);
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsAndNotBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x171,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
  }
  if (pObj_00->Value == 0) {
    __assert_fail("pObj->Value > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x172,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
  }
  if ((uint)pCut == 0xffffffff) {
    iVar2 = Vec_IntSize(&p->vFreeSets);
    if (iVar2 == 0) {
      pvVar4 = calloc((long)(p->nSetWords << 0xc),8);
      iVar2 = Vec_PtrSize(&p->vMemSets);
      Vec_PtrPush(&p->vMemSets,pvVar4);
      for (pCut._0_4_ = 0xfff; -1 < (int)(uint)pCut; pCut._0_4_ = (uint)pCut - 1) {
        Vec_IntPush(&p->vFreeSets,iVar2 << 0xc | (uint)pCut);
        *(uint *)((long)pvVar4 + (long)(int)(uint)pCut * 0x18 + 0x14) =
             *(uint *)((long)pvVar4 + (long)(int)(uint)pCut * 0x18 + 0x14) & 0xffffff | 0xff000000;
      }
    }
    pCut._0_4_ = Vec_IntPop(&p->vFreeSets);
    Vec_IntWriteEntry(&p->vCutSets,iVar1,(uint)pCut);
    iVar1 = Abc_MaxInt(p->nFrontMax,(uint)pCut + 1);
    p->nFrontMax = iVar1;
  }
  else {
    uVar3 = pObj_00->Value - 1;
    pObj_00->Value = uVar3;
    if (uVar3 == 0) {
      Vec_IntPush(&p->vFreeSets,(uint)pCut);
      Vec_IntWriteEntry(&p->vCutSets,iVar1,-1);
    }
  }
  pvVar4 = Vec_PtrEntry(&p->vMemSets,(int)(uint)pCut >> 0xc);
  return (Lf_Cut_t *)((long)pvVar4 + (long)(int)(p->nSetWords * ((uint)pCut & 0xfff)) * 8);
}

Assistant:

static inline Lf_Cut_t * Lf_ManFetchSet( Lf_Man_t * p, int i )
{
    int uMaskPage = (1 << LF_LOG_PAGE) - 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, i );
    int iOffSet = Vec_IntEntry( &p->vOffsets, i );
    int Entry = Vec_IntEntry( &p->vCutSets, iOffSet );
    assert( Gia_ObjIsAndNotBuf(pObj) );
    assert( pObj->Value > 0 );
    if ( Entry == -1 ) // first visit
    {
        if ( Vec_IntSize(&p->vFreeSets) == 0 ) // add new
        {
            Lf_Cut_t * pCut = (Lf_Cut_t *)ABC_CALLOC( word, p->nSetWords * (1 << LF_LOG_PAGE) );
            int uMaskShift = Vec_PtrSize(&p->vMemSets) << LF_LOG_PAGE;
            Vec_PtrPush( &p->vMemSets, pCut );
            for ( Entry = uMaskPage; Entry >= 0; Entry-- )
            {
                Vec_IntPush( &p->vFreeSets, uMaskShift | Entry );
                pCut[Entry].nLeaves   = LF_NO_LEAF;
            }
        }
        Entry = Vec_IntPop( &p->vFreeSets );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, Entry );
        p->nFrontMax = Abc_MaxInt( p->nFrontMax, Entry + 1 );
    }
    else if ( --pObj->Value == 0 )
    {
        Vec_IntPush( &p->vFreeSets, Entry );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, -1 );
    }
    return (Lf_Cut_t *)((word *)Vec_PtrEntry(&p->vMemSets, Entry >> LF_LOG_PAGE) + p->nSetWords * (Entry & uMaskPage));
}